

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compareB44.cpp
# Opt level: O1

bool withinB44ErrorBounds(half (*A) [4],half (*B) [4])

{
  int iVar1;
  float *pfVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  uint uVar11;
  undefined1 auVar12 [14];
  int i_1;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  bool bVar16;
  byte bVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  half (*pahVar21) [4];
  ushort uVar22;
  int iVar23;
  half (*pahVar24) [4];
  int i;
  long lVar25;
  int j;
  long lVar26;
  int iVar27;
  bool bVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [16];
  short sVar34;
  short sVar39;
  short sVar40;
  short sVar42;
  undefined4 uVar41;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  int d [16];
  unsigned_short t [16];
  unsigned_short local_128 [24];
  int local_f8 [16];
  int local_b8 [18];
  unsigned_short A1 [16];
  undefined1 auVar32 [16];
  ushort uVar33;
  undefined1 auVar37 [16];
  
  bVar16 = true;
  lVar25 = 0;
  pahVar21 = A;
  pahVar24 = B;
  do {
    lVar26 = 0;
    do {
      fVar3 = *(float *)(_imath_half_to_float_table + (ulong)(*pahVar21)[lVar26]._h * 4);
      pfVar2 = (float *)(_imath_half_to_float_table + (ulong)(*pahVar24)[lVar26]._h * 4);
      if (fVar3 != *pfVar2) {
        bVar16 = false;
      }
      if (NAN(fVar3) || NAN(*pfVar2)) {
        bVar16 = false;
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 != 4);
    lVar25 = lVar25 + 1;
    pahVar24 = pahVar24 + 1;
    pahVar21 = pahVar21 + 1;
  } while (lVar25 != 4);
  bVar28 = true;
  if (!bVar16) {
    uVar15 = 0;
    do {
      uVar33 = A[uVar15 >> 2 & 0x3fffffff][(uint)uVar15 & 3]._h;
      if ((~uVar33 & 0x7c00) == 0) {
        A1[uVar15 + 0xc] = 0x8000;
      }
      else {
        if ((short)uVar33 < 0) {
          uVar33 = ~uVar33;
        }
        else {
          uVar33 = uVar33 | 0x8000;
        }
        A1[uVar15 + 0xc] = uVar33;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != 0x10);
    lVar25 = 0;
    auVar36 = ZEXT816(0);
    do {
      auVar31 = psubusw(*(undefined1 (*) [16])(A1 + lVar25 + 0xc),auVar36);
      auVar29._0_2_ = auVar31._0_2_ + auVar36._0_2_;
      auVar29._2_2_ = auVar31._2_2_ + auVar36._2_2_;
      auVar29._4_2_ = auVar31._4_2_ + auVar36._4_2_;
      auVar29._6_2_ = auVar31._6_2_ + auVar36._6_2_;
      auVar29._8_2_ = auVar31._8_2_ + auVar36._8_2_;
      auVar29._10_2_ = auVar31._10_2_ + auVar36._10_2_;
      auVar32._12_2_ = auVar31._12_2_ + auVar36._12_2_;
      auVar32._0_12_ = auVar29;
      auVar32._14_2_ = auVar31._14_2_ + auVar36._14_2_;
      lVar25 = lVar25 + 8;
      auVar36 = auVar32;
    } while (lVar25 != 0x10);
    auVar35._4_4_ = auVar32._12_4_;
    auVar35._0_4_ = auVar29._8_4_;
    auVar35._8_4_ = auVar29._8_4_;
    auVar35._12_4_ = auVar32._12_4_;
    auVar36 = psubusw(auVar35,auVar32);
    sVar34 = auVar36._0_2_ + auVar29._0_2_;
    sVar39 = auVar36._2_2_ + auVar29._2_2_;
    sVar40 = auVar36._4_2_ + auVar29._4_2_;
    sVar42 = auVar36._6_2_ + auVar29._6_2_;
    auVar37._0_8_ = CONCAT26(sVar42,CONCAT24(sVar40,CONCAT22(sVar39,sVar34)));
    auVar37._8_2_ = auVar36._8_2_ + auVar29._8_2_;
    auVar37._10_2_ = auVar36._10_2_ + auVar29._10_2_;
    auVar37._12_2_ = auVar36._12_2_ + auVar32._12_2_;
    auVar37._14_2_ = auVar36._14_2_ + auVar32._14_2_;
    uVar41 = (undefined4)((ulong)auVar37._0_8_ >> 0x20);
    auVar36._4_4_ = uVar41;
    auVar36._0_4_ = uVar41;
    auVar36._8_4_ = uVar41;
    auVar36._12_4_ = uVar41;
    auVar36 = psubusw(auVar36,auVar37);
    sVar34 = auVar36._0_2_ + sVar34;
    uVar33 = auVar36._2_2_ + sVar39;
    auVar30._0_8_ =
         CONCAT26(auVar36._6_2_ + sVar42,CONCAT24(auVar36._4_2_ + sVar40,CONCAT22(uVar33,sVar34)));
    auVar30._8_2_ = auVar36._8_2_ + auVar37._8_2_;
    auVar30._10_2_ = auVar36._10_2_ + auVar37._10_2_;
    auVar31._12_2_ = auVar36._12_2_ + auVar37._12_2_;
    auVar31._0_12_ = auVar30;
    auVar31._14_2_ = auVar36._14_2_ + auVar37._14_2_;
    auVar38._2_2_ = 0;
    auVar38._0_2_ = uVar33;
    auVar38._4_4_ = (uint)((ulong)auVar30._0_8_ >> 0x30);
    auVar38._8_4_ = auVar30._8_4_ >> 0x10;
    auVar38._12_4_ = auVar31._12_4_ >> 0x10;
    auVar36 = psubusw(auVar38,auVar31);
    uVar33 = auVar36._0_2_ + sVar34;
    uVar11 = (uint)uVar33;
    iVar18 = -1;
    A1._0_8_ = B;
    do {
      iVar1 = iVar18 + 1;
      bVar17 = (byte)iVar1;
      uVar13 = iVar18 + 2;
      uVar19 = ~(-1 << (bVar17 & 0x1f));
      lVar25 = 0;
      do {
        uVar15 = *(ulong *)(A1 + lVar25 + 0xc);
        auVar8._8_4_ = 0;
        auVar8._0_8_ = uVar15;
        auVar8._12_2_ = (short)(uVar15 >> 0x30);
        auVar9._8_2_ = (short)(uVar15 >> 0x20);
        auVar9._0_8_ = uVar15;
        auVar9._10_4_ = auVar8._10_4_;
        auVar12._6_8_ = 0;
        auVar12._0_6_ = auVar9._8_6_;
        auVar10._4_2_ = (short)(uVar15 >> 0x10);
        auVar10._0_4_ = (uint)uVar15;
        auVar10._6_8_ = SUB148(auVar12 << 0x40,6);
        uVar4 = (uVar11 - ((uint)uVar15 & 0xffff)) * 2;
        uVar5 = (uVar11 - auVar10._4_4_) * 2;
        uVar6 = (uVar11 - auVar9._8_4_) * 2;
        uVar7 = (uVar11 - (auVar8._10_4_ >> 0x10)) * 2;
        uVar15 = (ulong)uVar13;
        local_b8[lVar25] = (int)(uVar4 + uVar19 + (uVar4 >> uVar15 & 1)) >> ZEXT416(uVar13);
        local_b8[lVar25 + 1] = (int)(uVar5 + uVar19 + (uVar5 >> uVar15 & 1)) >> ZEXT416(uVar13);
        local_b8[lVar25 + 2] = (int)(uVar6 + uVar19 + (uVar6 >> uVar15 & 1)) >> ZEXT416(uVar13);
        local_b8[lVar25 + 3] = (int)(uVar7 + uVar19 + (uVar7 >> uVar15 & 1)) >> ZEXT416(uVar13);
        lVar25 = lVar25 + 4;
      } while (lVar25 != 0x10);
      iVar20 = (local_b8[0] - local_b8[4]) + 0x20;
      iVar14 = local_b8[4] - local_b8[8];
      local_f8[1] = iVar14 + 0x20;
      local_f8[2] = (local_b8[8] - local_b8[0xc]) + 0x20;
      local_f8[3] = (local_b8[0] - local_b8[1]) + 0x20;
      local_f8[4] = (local_b8[4] - local_b8[5]) + 0x20;
      local_f8[5] = (local_b8[8] - local_b8[9]) + 0x20;
      local_f8[6] = (local_b8[0xc] - local_b8[0xd]) + 0x20;
      local_f8[7] = (local_b8[1] - local_b8[2]) + 0x20;
      local_f8[8] = (local_b8[5] - local_b8[6]) + 0x20;
      local_f8[9] = (local_b8[9] - local_b8[10]) + 0x20;
      local_f8[10] = (local_b8[0xd] - local_b8[0xe]) + 0x20;
      local_f8[0xb] = (local_b8[2] - local_b8[3]) + 0x20;
      local_f8[0xc] = (local_b8[6] - local_b8[7]) + 0x20;
      local_f8[0xd] = (local_b8[10] - local_b8[0xb]) + 0x20;
      local_f8[0xe] = (local_b8[0xe] - local_b8[0xf]) + 0x20;
      lVar25 = 1;
      iVar27 = iVar20;
      iVar23 = iVar20;
      do {
        iVar18 = local_f8[lVar25];
        if (iVar18 <= iVar23) {
          iVar23 = iVar18;
        }
        if (iVar18 < iVar27) {
          iVar18 = iVar27;
        }
        iVar27 = iVar18;
        lVar25 = lVar25 + 1;
      } while (lVar25 != 0xf);
      iVar18 = iVar1;
    } while ((iVar23 < 0) || (0x3f < iVar27));
    A1[0xc] = uVar33 - (short)(local_b8[0] << (bVar17 & 0x1f));
    local_128[0] = A1[0xc];
    sVar34 = (short)(-0x20 << (bVar17 & 0x1f));
    local_128[4] = (short)(iVar20 << (bVar17 & 0x1f)) + A1[0xc] + sVar34;
    local_128[1] = (short)(local_f8[3] << (bVar17 & 0x1f)) + A1[0xc] + sVar34;
    local_128[8] = (short)(iVar14 << (bVar17 & 0x1f)) + local_128[4];
    local_128[0xc] =
         (short)((local_b8[8] - local_b8[0xc]) + iVar14 << (bVar17 & 0x1f)) + local_128[4];
    local_128[5] = (short)(local_f8[4] << (bVar17 & 0x1f)) + sVar34 + local_128[4];
    local_128[9] = (short)(local_f8[5] << (bVar17 & 0x1f)) + sVar34 + local_128[8];
    local_128[0xd] = (short)(local_f8[6] << (bVar17 & 0x1f)) + sVar34 + local_128[0xc];
    local_128[2] = (short)(local_f8[7] << (bVar17 & 0x1f)) + sVar34 + local_128[1];
    local_128[6] = (short)(local_f8[8] << (bVar17 & 0x1f)) + sVar34 + local_128[5];
    local_128[10] = (short)(local_f8[9] << (bVar17 & 0x1f)) + sVar34 + local_128[9];
    local_128[0xe] = (short)(local_f8[10] << (bVar17 & 0x1f)) + sVar34 + local_128[0xd];
    local_128[3] = (short)(local_f8[0xb] << (bVar17 & 0x1f)) + sVar34 + local_128[2];
    local_128[7] = (short)(local_f8[0xc] << (bVar17 & 0x1f)) + sVar34 + local_128[6];
    local_128[0xb] = (short)(local_f8[0xd] << (bVar17 & 0x1f)) + sVar34 + local_128[10];
    local_128[0xf] = (short)(local_f8[0xe] << (bVar17 & 0x1f)) + sVar34 + local_128[0xe];
    uVar15 = 0;
    bVar28 = false;
    do {
      uVar33 = *(ushort *)
                (A1._0_8_ + (uVar15 >> 2 & 0x3fffffff) * 8 + (ulong)((uint)uVar15 & 3) * 2);
      uVar22 = uVar33 | 0x8000;
      if ((short)uVar33 < 0) {
        uVar22 = ~uVar33;
      }
      if (local_128[uVar15] + 5 < (uint)uVar22) {
        return bVar28;
      }
      if ((int)(uint)uVar22 < (int)(local_128[uVar15] - 5)) {
        return bVar28;
      }
      bVar28 = 0xe < uVar15;
      uVar15 = uVar15 + 1;
    } while (uVar15 != 0x10);
  }
  return bVar28;
}

Assistant:

bool
withinB44ErrorBounds (const half A[4][4], const half B[4][4])
{
    //
    // Assuming that a 4x4 pixel block, B, was generated by
    // compressing and uncompressing another pixel block, A,
    // using OpenEXR's B44 compression method, check whether
    // the differences between A and B are what we would
    // expect from the compressor.
    //

    //
    // The block may not have been compressed at all if it
    // was part of a very small tile.
    //

    bool equal = true;

    for (int i = 0; i < 4; ++i)
        for (int j = 0; j < 4; ++j)
            if (A[i][j] != B[i][j]) equal = false;

    if (equal) return true;

    //
    // The block was compressed.
    //
    // Perform a "light" version of the B44 compression on A
    // (see the pack() function in ImfB44Compressor.cpp).
    //

    unsigned short t[16];

    for (int i = 0; i < 16; ++i)
    {
        unsigned short Abits = A[i / 4][i % 4].bits ();

        if ((Abits & 0x7c00) == 0x7c00)
            t[i] = 0x8000;
        else if (Abits & 0x8000)
            t[i] = ~Abits;
        else
            t[i] = Abits | 0x8000;
    }

    unsigned short tMax = 0;

    for (int i = 0; i < 16; ++i)
        if (tMax < t[i]) tMax = t[i];

    int shift = -1;
    int d[16];
    int r[15];
    int rMin;
    int rMax;

    do
    {
        shift += 1;

        for (int i = 0; i < 16; ++i)
            d[i] = shiftAndRound (tMax - t[i], shift);

        const int bias = 0x20;

        r[0] = d[0] - d[4] + bias;
        r[1] = d[4] - d[8] + bias;
        r[2] = d[8] - d[12] + bias;

        r[3] = d[0] - d[1] + bias;
        r[4] = d[4] - d[5] + bias;
        r[5] = d[8] - d[9] + bias;
        r[6] = d[12] - d[13] + bias;

        r[7]  = d[1] - d[2] + bias;
        r[8]  = d[5] - d[6] + bias;
        r[9]  = d[9] - d[10] + bias;
        r[10] = d[13] - d[14] + bias;

        r[11] = d[2] - d[3] + bias;
        r[12] = d[6] - d[7] + bias;
        r[13] = d[10] - d[11] + bias;
        r[14] = d[14] - d[15] + bias;

        rMin = r[0];
        rMax = r[0];

        for (int i = 1; i < 15; ++i)
        {
            if (rMin > r[i]) rMin = r[i];

            if (rMax < r[i]) rMax = r[i];
        }
    } while (rMin < 0 || rMax > 0x3f);

    t[0] = tMax - (d[0] << shift);

    //
    // Now perform a "light" version of the decompression method.
    // (see the unpack() function in ImfB44Compressor.cpp).
    //

    unsigned short A1[16];
    const int      bias = 0x20 << shift;

    A1[0]  = t[0];
    A1[4]  = A1[0] + (r[0] << shift) - bias;
    A1[8]  = A1[4] + (r[1] << shift) - bias;
    A1[12] = A1[8] + (r[2] << shift) - bias;

    A1[1]  = A1[0] + (r[3] << shift) - bias;
    A1[5]  = A1[4] + (r[4] << shift) - bias;
    A1[9]  = A1[8] + (r[5] << shift) - bias;
    A1[13] = A1[12] + (r[6] << shift) - bias;

    A1[2]  = A1[1] + (r[7] << shift) - bias;
    A1[6]  = A1[5] + (r[8] << shift) - bias;
    A1[10] = A1[9] + (r[9] << shift) - bias;
    A1[14] = A1[13] + (r[10] << shift) - bias;

    A1[3]  = A1[2] + (r[11] << shift) - bias;
    A1[7]  = A1[6] + (r[12] << shift) - bias;
    A1[11] = A1[10] + (r[13] << shift) - bias;
    A1[15] = A1[14] + (r[14] << shift) - bias;

    //
    // Compare the result with B, allowing for an difference
    // of a couple of units in the last place.
    //

    for (int i = 0; i < 16; ++i)
    {
        unsigned short A1bits = A1[i];
        unsigned short Bbits  = B[i / 4][i % 4].bits ();

        if (Bbits & 0x8000)
            Bbits = ~Bbits;
        else
            Bbits = Bbits | 0x8000;

        if (Bbits > A1bits + 5 || Bbits < A1bits - 5) return false;
    }

    return true;
}